

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall CLIntercept::callLoggingInfo(CLIntercept *this,char *formatStr,...)

{
  char in_AL;
  uint uVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  allocator local_109;
  string local_108;
  undefined8 local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  local_d8 = local_c8;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_e0 = &stack0x00000008;
  local_e8 = 0x3000000010;
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  uVar1 = vsnprintf(this->m_StringBuffer,0x4000,formatStr,&local_e8);
  if (uVar1 < 0x4000) {
    std::__cxx11::string::string((string *)&local_108,this->m_StringBuffer,&local_109);
    callLoggingInfo(this,&local_108);
  }
  else {
    std::__cxx11::string::string((string *)&local_108,"too long",&local_109);
    callLoggingInfo(this,&local_108);
  }
  std::__cxx11::string::~string((string *)&local_108);
  return;
}

Assistant:

void CLIntercept::callLoggingInfo(
    const char* formatStr,
    ... )
{
    va_list args;
    va_start( args, formatStr );

    int size = CLI_VSPRINTF( m_StringBuffer, CLI_STRING_BUFFER_SIZE, formatStr, args );
    if( size >= 0 && size < CLI_STRING_BUFFER_SIZE )
    {
        callLoggingInfo( std::string( m_StringBuffer ) );
    }
    else
    {
        callLoggingInfo( std::string( "too long" ) );
    }

    va_end( args );
}